

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O2

bool __thiscall bssl::Array<int>::Init(Array<int> *this,size_t new_size)

{
  bool bVar1;
  
  bVar1 = InitUninitialized(this,new_size);
  if (bVar1) {
    std::__uninitialized_default_n_1<true>::__uninit_default_n<int*,unsigned_long>
              (this->data_,this->size_);
  }
  return bVar1;
}

Assistant:

[[nodiscard]] bool Init(size_t new_size) {
    if (!InitUninitialized(new_size)) {
      return false;
    }
    std::uninitialized_value_construct_n(data_, size_);
    return true;
  }